

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_setup(Curl_easy *data)

{
  uchar *plaintext;
  uint uVar1;
  connectdata *pcVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  uchar nt [24];
  smb_setup msg;
  
  pcVar2 = data->conn;
  sVar4 = strlen((char *)(pcVar2->proto).rtspc.buf.leng);
  sVar5 = strlen((char *)(pcVar2->proto).rtspc.buf.allc);
  uVar6 = sVar4 + sVar5 + 0x3d;
  CVar3 = CURLE_FILESIZE_EXCEEDED;
  if (uVar6 < 0x401) {
    Curl_ntlm_core_mk_lm_hash(pcVar2->passwd,lm_hash);
    plaintext = (pcVar2->proto).smbc.challenge;
    Curl_ntlm_core_lm_resp(lm_hash,plaintext,lm);
    Curl_ntlm_core_mk_nt_hash(pcVar2->passwd,nt_hash);
    Curl_ntlm_core_lm_resp(nt_hash,plaintext,nt);
    msg.andx.pad = '\0';
    msg.andx.offset = 0;
    msg.pad._0_2_ = 0;
    msg.word_count = '\r';
    msg.andx.command = 0xff;
    msg.max_buffer_size = 0x9000;
    msg.max_mpx_count = 1;
    msg.vc_number = 1;
    uVar1 = (pcVar2->proto).smbc.session_key;
    msg.session_key._0_2_ = (undefined2)uVar1;
    msg.session_key._2_2_ = (undefined2)(uVar1 >> 0x10);
    msg._21_8_ = 0x80000;
    msg.lengths[0] = 0x18;
    msg.lengths[1] = 0x18;
    msg.bytes[0] = lm[0];
    msg.bytes[1] = lm[1];
    msg.bytes[2] = lm[2];
    msg.bytes[3] = lm[3];
    msg.bytes[4] = lm[4];
    msg.bytes[5] = lm[5];
    msg.bytes[6] = lm[6];
    msg.bytes[7] = lm[7];
    msg.bytes[8] = lm[8];
    msg.bytes[9] = lm[9];
    msg.bytes[10] = lm[10];
    msg.bytes[0xb] = lm[0xb];
    msg.bytes[0xc] = lm[0xc];
    msg.bytes[0xd] = lm[0xd];
    msg.bytes[0xe] = lm[0xe];
    msg.bytes[0xf] = lm[0xf];
    msg.bytes[0x10] = lm[0x10];
    msg.bytes[0x11] = lm[0x11];
    msg.bytes[0x12] = lm[0x12];
    msg.bytes[0x13] = lm[0x13];
    msg.bytes[0x14] = lm[0x14];
    msg.bytes[0x15] = lm[0x15];
    msg.bytes[0x16] = lm[0x16];
    msg.bytes[0x17] = lm[0x17];
    msg.bytes[0x18] = nt[0];
    msg.bytes[0x19] = nt[1];
    msg.bytes[0x1a] = nt[2];
    msg.bytes[0x1b] = nt[3];
    msg.bytes[0x1c] = nt[4];
    msg.bytes[0x1d] = nt[5];
    msg.bytes[0x1e] = nt[6];
    msg.bytes[0x1f] = nt[7];
    msg.bytes[0x20] = nt[8];
    msg.bytes[0x21] = nt[9];
    msg.bytes[0x22] = nt[10];
    msg.bytes[0x23] = nt[0xb];
    msg.bytes[0x24] = nt[0xc];
    msg.bytes[0x25] = nt[0xd];
    msg.bytes[0x26] = nt[0xe];
    msg.bytes[0x27] = nt[0xf];
    msg.bytes[0x28] = nt[0x10];
    msg.bytes[0x29] = nt[0x11];
    msg.bytes[0x2a] = nt[0x12];
    msg.bytes[0x2b] = nt[0x13];
    msg.bytes[0x2c] = nt[0x14];
    msg.bytes[0x2d] = nt[0x15];
    msg.bytes[0x2e] = nt[0x16];
    msg.bytes[0x2f] = nt[0x17];
    curl_msnprintf(msg.bytes + 0x30,sVar4 + sVar5 + 0xd,"%s%c%s%c%s%c%s",
                   *(undefined8 *)&(pcVar2->proto).ftpc.pp.pending_resp,0,
                   (pcVar2->proto).ftpc.pp.sendthis,0,"Linux",0,"curl");
    msg.byte_count = (unsigned_short)uVar6;
    CVar3 = smb_send_message(data,'s',&msg,sVar4 + sVar5 + 0x5a);
  }
  return CVar3;
}

Assistant:

static CURLcode smb_send_setup(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  const size_t byte_count = sizeof(lm) + sizeof(nt) +
    strlen(smbc->user) + strlen(smbc->domain) +
    strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
  Curl_ntlm_core_mk_nt_hash(conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);

  memset(&msg, 0, sizeof(msg) - sizeof(msg.bytes));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  p += msnprintf(p, byte_count - sizeof(nt) - sizeof(lm),
                 "%s%c"  /* user */
                 "%s%c"  /* domain */
                 "%s%c"  /* OS */
                 "%s", /* client name */
                 smbc->user, 0, smbc->domain, 0, OS, 0, CLIENTNAME);
  p++; /* count the final null termination */
  DEBUGASSERT(byte_count == (size_t)(p - msg.bytes));
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}